

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alrecord.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  FILE *pFVar7;
  long lVar8;
  void *__ptr;
  size_t sVar9;
  char *pcVar10;
  undefined8 uVar11;
  uint uVar12;
  char **ppcVar13;
  char *pcVar14;
  undefined2 uVar15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  char *pcVar19;
  ulong __nmemb;
  float fVar20;
  char *end;
  void *local_70;
  char *local_68;
  char *local_60;
  uint local_54;
  double local_50;
  double local_48;
  char *local_40;
  long local_38;
  
  pcVar14 = *argv;
  if (argc < 2) {
LAB_001024ec:
    fprintf(_stderr,
            "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
            ,pcVar14,
            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
           );
    return 0;
  }
  ppcVar13 = argv + 1;
  uVar16 = 1;
  local_60 = pcVar14;
  if (argc == 2) {
    local_68 = (char *)0x0;
    iVar17 = 1;
  }
  else {
    iVar17 = strcmp(*ppcVar13,"-device");
    if (iVar17 == 0) {
      pcVar14 = argv[2];
      iVar17 = argc + -3;
      if (iVar17 == 0) {
        uVar11 = 0x1101;
        local_60 = "record.wav";
        dVar18 = 2.1788294981599e-319;
        uVar15 = 1;
        local_48 = (double)CONCAT44(local_48._4_4_,0x40800000);
        uVar12 = 0;
        local_54 = 2;
        local_40 = "Mono";
        local_70 = (void *)0x10;
        goto LAB_001029e3;
      }
      ppcVar13 = argv + 3;
      local_68 = pcVar14;
    }
    else {
      iVar17 = argc + -1;
      local_68 = (char *)0x0;
    }
  }
  iVar17 = iVar17 + 2;
  pcVar19 = "record.wav";
  local_50 = 2.1788294981599e-319;
  local_70 = (void *)0x10;
  local_48 = (double)CONCAT44(local_48._4_4_,0x40800000);
  do {
    pcVar10 = *ppcVar13;
    cVar1 = *pcVar10;
    if (cVar1 == '-') {
      if ((pcVar10[1] == '-') && (pcVar10[2] == '\0')) break;
      iVar5 = strcmp(pcVar10,"--channels");
      if (iVar5 == 0) goto LAB_001026a9;
      if (pcVar10[1] == 'c') {
        if (pcVar10[2] == '\0') goto LAB_001026a9;
        iVar5 = strcmp(pcVar10,"--bits");
      }
      else {
        iVar5 = strcmp(pcVar10,"--bits");
      }
      if ((iVar5 == 0) || ((pcVar10[1] == 'b' && (pcVar10[2] == '\0')))) goto LAB_00102757;
      iVar5 = strcmp(pcVar10,"--rate");
      if (iVar5 == 0) {
LAB_001027b0:
        if (iVar17 == 3) goto LAB_00102943;
        local_50 = (double)strtoul(ppcVar13[1],&end,0);
        if ((88000 < SUB84(local_50,0) - 8000U) ||
           ((pcVar14 = (char *)CONCAT44(end._4_4_,CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)))
            , pcVar14 != (char *)0x0 && (*pcVar14 != '\0')))) {
          main_cold_2();
          return 1;
        }
      }
      else {
LAB_0010272b:
        if (pcVar10[1] == 'r') {
          if (pcVar10[2] == '\0') goto LAB_001027b0;
          iVar5 = strcmp(pcVar10,"--time");
          if (iVar5 != 0) goto LAB_00102811;
        }
        else {
          iVar5 = strcmp(pcVar10,"--time");
          if (iVar5 != 0) {
            if (cVar1 != '-') goto LAB_00102884;
LAB_00102811:
            if ((pcVar10[1] != 't') || (pcVar10[2] != '\0')) {
              iVar5 = strcmp(pcVar10,"--outfile");
              if (iVar5 != 0) goto LAB_001028a1;
              goto LAB_001028b5;
            }
          }
        }
LAB_00102835:
        if (iVar17 == 3) goto LAB_00102943;
        fVar20 = strtof(ppcVar13[1],&end);
        local_48 = (double)CONCAT44(local_48._4_4_,fVar20);
        if (((fVar20 < 1.0) || (10.0 < fVar20)) ||
           ((pcVar14 = (char *)CONCAT44(end._4_4_,CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)))
            , pcVar14 != (char *)0x0 && (*pcVar14 != '\0')))) {
          main_cold_1();
          return 1;
        }
      }
    }
    else {
      iVar5 = strcmp(pcVar10,"--channels");
      if (iVar5 == 0) {
LAB_001026a9:
        if (iVar17 == 3) {
LAB_00102943:
          fprintf(_stderr,"Missing argument for option: %s\n",pcVar10);
          return 1;
        }
        uVar16 = strtoul(ppcVar13[1],&end,0);
        if (((int)uVar16 - 3U < 0xfffffffe) ||
           ((pcVar14 = (char *)CONCAT44(end._4_4_,CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)))
            , pcVar14 != (char *)0x0 && (*pcVar14 != '\0')))) {
          main_cold_4();
          return 1;
        }
      }
      else {
        iVar5 = strcmp(pcVar10,"--bits");
        if (iVar5 == 0) {
LAB_00102757:
          if (iVar17 == 3) goto LAB_00102943;
          local_70 = (void *)strtoul(ppcVar13[1],&end,0);
          if (((0x20 < (uint)local_70) || ((0x100010100U >> ((ulong)local_70 & 0x3f) & 1) == 0)) ||
             ((pcVar14 = (char *)CONCAT44(end._4_4_,
                                          CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end))),
              pcVar14 != (char *)0x0 && (*pcVar14 != '\0')))) {
            main_cold_3();
            return 1;
          }
        }
        else {
          iVar5 = strcmp(pcVar10,"--rate");
          if (iVar5 == 0) goto LAB_001027b0;
          if (cVar1 == '-') goto LAB_0010272b;
          iVar5 = strcmp(pcVar10,"--time");
          if (iVar5 == 0) goto LAB_00102835;
LAB_00102884:
          iVar5 = strcmp(pcVar10,"--outfile");
          if (iVar5 != 0) {
            if (cVar1 == '-') {
LAB_001028a1:
              if (pcVar10[1] == 'o') {
                if (pcVar10[2] == '\0') goto LAB_001028b5;
                iVar17 = strcmp(pcVar10,"--help");
                pcVar14 = local_60;
                if (iVar17 == 0) goto LAB_001024ec;
              }
              else {
                iVar17 = strcmp(pcVar10,"--help");
                pcVar14 = local_60;
                if (iVar17 == 0) goto LAB_001024ec;
                if (cVar1 != '-') goto LAB_00102eae;
              }
              if ((pcVar10[1] != 'h') || (pcVar14 = local_60, pcVar10[2] != '\0')) {
LAB_00102eae:
                fprintf(_stderr,
                        "Invalid option \'%s\'.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                        ,pcVar10,local_60,
                        "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                       );
                return 0;
              }
            }
            else {
              iVar17 = strcmp(pcVar10,"--help");
              pcVar14 = local_60;
              if (iVar17 != 0) goto LAB_00102eae;
            }
            goto LAB_001024ec;
          }
LAB_001028b5:
          if (iVar17 == 3) goto LAB_00102943;
          pcVar19 = ppcVar13[1];
        }
      }
    }
    ppcVar13 = ppcVar13 + 2;
    iVar17 = iVar17 + -2;
  } while (2 < iVar17);
  iVar5 = (int)uVar16;
  iVar17 = (int)local_70;
  uVar12 = iVar5 * iVar17;
  local_54 = uVar12 >> 3;
  uVar11 = 0;
  if (iVar5 == 2) {
    uVar16 = 2;
    local_40 = "Stereo";
    if (iVar17 == 8) {
      uVar11 = 0x1102;
    }
    else if (iVar17 == 0x20) {
      uVar11 = 0x10011;
    }
    else if (iVar17 == 0x10) {
      uVar11 = 0x1103;
    }
  }
  else if (iVar5 == 1) {
    uVar16 = 1;
    local_40 = "Mono";
    if (iVar17 == 8) {
      uVar11 = 0x1100;
    }
    else if (iVar17 == 0x20) {
      uVar11 = 0x10010;
    }
    else if (iVar17 == 0x10) {
      uVar11 = 0x1101;
    }
  }
  else {
    local_40 = "Stereo";
  }
  uVar15 = (undefined2)uVar16;
  pcVar14 = local_68;
  dVar18 = local_50;
  local_60 = pcVar19;
LAB_001029e3:
  lVar6 = alcCaptureOpenDevice(pcVar14,(ulong)dVar18 & 0xffffffff,uVar11,0x8000);
  pFVar7 = _stderr;
  if (lVar6 == 0) {
    pcVar19 = "default device";
    if (pcVar14 != (char *)0x0) {
      pcVar19 = pcVar14;
    }
    pcVar14 = "Signed";
    if ((int)local_70 == 8) {
      pcVar14 = "Unsigned";
    }
    pcVar10 = "Float";
    if ((int)local_70 != 0x20) {
      pcVar10 = pcVar14;
    }
    fprintf(_stderr,"Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",pcVar19,pcVar10,local_70
            ,local_40,dVar18,0x8000);
  }
  else {
    local_50 = dVar18;
    uVar11 = alcGetString(lVar6,0x310);
    fprintf(pFVar7,"Opened \"%s\"\n",uVar11);
    pcVar14 = local_60;
    pFVar7 = fopen(local_60,"wb");
    if (pFVar7 == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open \'%s\' for writing\n",pcVar14);
      alcCaptureCloseDevice(lVar6);
    }
    else {
      fputs("RIFF",pFVar7);
      end._0_1_ = 0xff;
      end._1_1_ = 0xff;
      end._2_2_ = 0xffff;
      fwrite(&end,1,4,pFVar7);
      fputs("WAVE",pFVar7);
      fputs("fmt ",pFVar7);
      end._0_1_ = 0x12;
      end._1_1_ = 0;
      end._2_2_ = 0;
      fwrite(&end,1,4,pFVar7);
      end._0_1_ = ((int)local_70 == 0x20) * '\x02' + '\x01';
      end._1_1_ = 0;
      fwrite(&end,1,2,pFVar7);
      end._0_1_ = (char)uVar15;
      end._1_1_ = (undefined1)((ushort)uVar15 >> 8);
      fwrite(&end,1,2,pFVar7);
      iVar17 = SUB84(local_50,0);
      end._0_1_ = SUB81(local_50,0);
      end._1_1_ = (undefined1)((ulong)local_50 >> 8);
      end._2_2_ = (undefined2)((ulong)local_50 >> 0x10);
      fwrite(&end,1,4,pFVar7);
      uVar4 = local_54;
      iVar17 = local_54 * iVar17;
      end._0_1_ = (char)iVar17;
      end._1_1_ = (undefined1)((uint)iVar17 >> 8);
      end._2_2_ = (undefined2)((uint)iVar17 >> 0x10);
      fwrite(&end,1,4,pFVar7);
      end._0_1_ = (char)uVar4;
      end._1_1_ = (undefined1)(uVar12 >> 0xb);
      fwrite(&end,1,2,pFVar7);
      end._0_1_ = (char)local_70;
      end._1_1_ = (undefined1)((ulong)local_70 >> 8);
      fwrite(&end,1,2,pFVar7);
      end._0_1_ = 0;
      end._1_1_ = 0;
      fwrite(&end,1,2,pFVar7);
      fputs("data",pFVar7);
      end._0_1_ = 0xff;
      end._1_1_ = 0xff;
      end._2_2_ = 0xffff;
      fwrite(&end,1,4,pFVar7);
      lVar8 = ftell(pFVar7);
      iVar17 = ferror(pFVar7);
      dVar18 = local_50;
      if ((3 < lVar8) && (iVar17 == 0)) {
        pcVar14 = "Signed";
        if ((int)local_70 == 8) {
          pcVar14 = "Unsigned";
        }
        pcVar19 = "Float";
        if ((int)local_70 != 0x20) {
          pcVar19 = pcVar14;
        }
        bVar2 = NAN(local_48._0_4_);
        bVar3 = local_48._0_4_ != 1.0;
        local_48 = (double)local_48._0_4_;
        pcVar14 = "";
        if (bVar3) {
          pcVar14 = "s";
        }
        if (bVar2) {
          pcVar14 = "s";
        }
        local_38 = lVar8;
        fprintf(_stderr,"Recording \'%s\', %s %d-bit, %s, %dhz (%g second%s)\n",local_60,pcVar19,
                local_70,local_40,local_50,pcVar14);
        alcCaptureStart(lVar6);
        local_50 = (double)((ulong)dVar18 & 0xffffffff);
        if (local_48 <= 0.0 / local_50) {
          local_70 = (void *)0x0;
          uVar16 = 0;
          iVar17 = 0;
        }
        else {
          __nmemb = (ulong)local_54;
          uVar16 = 0;
          local_70 = (void *)0x0;
          local_60 = (char *)((ulong)local_60 & 0xffffffff00000000);
          do {
            iVar17 = alcGetError(lVar6);
            if (iVar17 != 0) break;
            iVar5 = ferror(pFVar7);
            iVar17 = 0;
            if (iVar5 != 0) break;
            end._0_1_ = 0;
            end._1_1_ = 0;
            end._2_2_ = 0;
            fprintf(_stderr,"\rCaptured %u samples",uVar16);
            alcGetIntegerv(lVar6,0x312,1,&end);
            iVar5 = CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end));
            if ((long)iVar5 < 1) {
              al_nssleep(10000000);
            }
            else {
              local_68 = (char *)CONCAT44(local_68._4_4_,(int)uVar16);
              __ptr = local_70;
              if ((int)local_60 < iVar5) {
                __ptr = calloc(__nmemb,(long)iVar5);
                free(local_70);
                local_60 = (char *)CONCAT44(local_60._4_4_,
                                            CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)));
              }
              alcCaptureSamples(lVar6,__ptr);
              local_70 = __ptr;
              sVar9 = fwrite(__ptr,__nmemb,(ulong)CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)),
                             pFVar7);
              uVar16 = (ulong)(uint)((int)local_68 + (int)sVar9);
            }
          } while ((double)uVar16 / local_50 < local_48);
        }
        lVar8 = local_38 + -4;
        alcCaptureStop(lVar6);
        fprintf(_stderr,"\rCaptured %u samples\n",uVar16);
        if (iVar17 != 0) {
          main_cold_5();
        }
        alcCaptureCloseDevice(lVar6);
        free(local_70);
        lVar6 = ftell(pFVar7);
        iVar17 = fseek(pFVar7,lVar8,0);
        if (iVar17 == 0) {
          fwrite32le((int)uVar16 * local_54,(FILE *)pFVar7);
          iVar17 = fseek(pFVar7,4,0);
          if (iVar17 == 0) {
            fwrite32le((int)lVar6 - 8,(FILE *)pFVar7);
          }
        }
        fclose(pFVar7);
        return 0;
      }
      main_cold_6();
    }
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    static const char optlist[] =
"    --channels/-c <channels>  Set channel count (1 or 2)\n"
"    --bits/-b <bits>          Set channel count (8, 16, or 32)\n"
"    --rate/-r <rate>          Set sample rate (8000 to 96000)\n"
"    --time/-t <time>          Time in seconds to record (1 to 10)\n"
"    --outfile/-o <filename>   Output filename (default: record.wav)";
    const char *fname = "record.wav";
    const char *devname = NULL;
    const char *progname;
    Recorder recorder;
    long total_size;
    ALenum format;
    ALCenum err;

    progname = argv[0];
    if(argc < 2)
    {
        fprintf(stderr, "Record from a device to a wav file.\n\n"
                "Usage: %s [-device <name>] [options...]\n\n"
                "Available options:\n%s\n", progname, optlist);
        return 0;
    }

    recorder.mDevice = NULL;
    recorder.mFile = NULL;
    recorder.mDataSizeOffset = 0;
    recorder.mDataSize = 0;
    recorder.mRecTime = 4.0f;
    recorder.mChannels = 1;
    recorder.mBits = 16;
    recorder.mSampleRate = 44100;
    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    argv++; argc--;
    if(argc > 1 && strcmp(argv[0], "-device") == 0)
    {
        devname = argv[1];
        argv += 2;
        argc -= 2;
    }

    while(argc > 0)
    {
        char *end;
        if(strcmp(argv[0], "--") == 0)
            break;
        else if(strcmp(argv[0], "--channels") == 0 || strcmp(argv[0], "-c") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mChannels = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mChannels != 1 && recorder.mChannels != 2) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid channels: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--bits") == 0 || strcmp(argv[0], "-b") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mBits = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mBits != 8 && recorder.mBits != 16 && recorder.mBits != 32) ||
               (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid bit count: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--rate") == 0 || strcmp(argv[0], "-r") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mSampleRate = (ALuint)strtoul(argv[1], &end, 0);
            if(!(recorder.mSampleRate >= 8000 && recorder.mSampleRate <= 96000) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid sample rate: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--time") == 0 || strcmp(argv[0], "-t") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mRecTime = strtof(argv[1], &end);
            if(!(recorder.mRecTime >= 1.0f && recorder.mRecTime <= 10.0f) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid record time: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--outfile") == 0 || strcmp(argv[0], "-o") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            fname = argv[1];
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--help") == 0 || strcmp(argv[0], "-h") == 0)
        {
            fprintf(stderr, "Record from a device to a wav file.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", progname, optlist);
            return 0;
        }
        else
        {
            fprintf(stderr, "Invalid option '%s'.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", argv[0], progname, optlist);
            return 0;
        }
    }

    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;

    format = AL_NONE;
    if(recorder.mChannels == 1)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_MONO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_MONO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_MONO_FLOAT32;
    }
    else if(recorder.mChannels == 2)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_STEREO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_STEREO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_STEREO_FLOAT32;
    }

    recorder.mDevice = alcCaptureOpenDevice(devname, recorder.mSampleRate, format, 32768);
    if(!recorder.mDevice)
    {
        fprintf(stderr, "Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",
            devname ? devname : "default device",
            (recorder.mBits == 32) ? "Float" :
            (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
            (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
            32768
        );
        return 1;
    }
    fprintf(stderr, "Opened \"%s\"\n", alcGetString(
        recorder.mDevice, ALC_CAPTURE_DEVICE_SPECIFIER
    ));

    recorder.mFile = fopen(fname, "wb");
    if(!recorder.mFile)
    {
        fprintf(stderr, "Failed to open '%s' for writing\n", fname);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fputs("RIFF", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'RIFF' header len; filled in at close

    fputs("WAVE", recorder.mFile);

    fputs("fmt ", recorder.mFile);
    fwrite32le(18, recorder.mFile); // 'fmt ' header len

    // 16-bit val, format type id (1 = integer PCM, 3 = float PCM)
    fwrite16le((recorder.mBits == 32) ? 0x0003 : 0x0001, recorder.mFile);
    // 16-bit val, channel count
    fwrite16le((ALushort)recorder.mChannels, recorder.mFile);
    // 32-bit val, frequency
    fwrite32le(recorder.mSampleRate, recorder.mFile);
    // 32-bit val, bytes per second
    fwrite32le(recorder.mSampleRate * recorder.mFrameSize, recorder.mFile);
    // 16-bit val, frame size
    fwrite16le((ALushort)recorder.mFrameSize, recorder.mFile);
    // 16-bit val, bits per sample
    fwrite16le((ALushort)recorder.mBits, recorder.mFile);
    // 16-bit val, extra byte count
    fwrite16le(0, recorder.mFile);

    fputs("data", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'data' header len; filled in at close

    recorder.mDataSizeOffset = ftell(recorder.mFile) - 4;
    if(ferror(recorder.mFile) || recorder.mDataSizeOffset < 0)
    {
        fprintf(stderr, "Error writing header: %s\n", strerror(errno));
        fclose(recorder.mFile);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fprintf(stderr, "Recording '%s', %s %d-bit, %s, %dhz (%g second%s)\n", fname,
        (recorder.mBits == 32) ? "Float" :
        (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
        (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
        recorder.mRecTime, (recorder.mRecTime != 1.0f) ? "s" : ""
    );

    err = ALC_NO_ERROR;
    alcCaptureStart(recorder.mDevice);
    while((double)recorder.mDataSize/(double)recorder.mSampleRate < recorder.mRecTime &&
          (err=alcGetError(recorder.mDevice)) == ALC_NO_ERROR && !ferror(recorder.mFile))
    {
        ALCint count = 0;
        fprintf(stderr, "\rCaptured %u samples", recorder.mDataSize);
        alcGetIntegerv(recorder.mDevice, ALC_CAPTURE_SAMPLES, 1, &count);
        if(count < 1)
        {
            al_nssleep(10000000);
            continue;
        }
        if(count > recorder.mBufferSize)
        {
            ALbyte *data = calloc(recorder.mFrameSize, (ALuint)count);
            free(recorder.mBuffer);
            recorder.mBuffer = data;
            recorder.mBufferSize = count;
        }
        alcCaptureSamples(recorder.mDevice, recorder.mBuffer, count);
#if defined(__BYTE_ORDER) && __BYTE_ORDER == __BIG_ENDIAN
        /* Byteswap multibyte samples on big-endian systems (wav needs little-
         * endian, and OpenAL gives the system's native-endian).
         */
        if(recorder.mBits == 16)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b = recorder.mBuffer[i*2 + 0];
                recorder.mBuffer[i*2 + 0] = recorder.mBuffer[i*2 + 1];
                recorder.mBuffer[i*2 + 1] = b;
            }
        }
        else if(recorder.mBits == 32)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b0 = recorder.mBuffer[i*4 + 0];
                ALbyte b1 = recorder.mBuffer[i*4 + 1];
                recorder.mBuffer[i*4 + 0] = recorder.mBuffer[i*4 + 3];
                recorder.mBuffer[i*4 + 1] = recorder.mBuffer[i*4 + 2];
                recorder.mBuffer[i*4 + 2] = b1;
                recorder.mBuffer[i*4 + 3] = b0;
            }
        }
#endif
        recorder.mDataSize += (ALuint)fwrite(recorder.mBuffer, recorder.mFrameSize, (ALuint)count,
                                             recorder.mFile);
    }
    alcCaptureStop(recorder.mDevice);
    fprintf(stderr, "\rCaptured %u samples\n", recorder.mDataSize);
    if(err != ALC_NO_ERROR)
        fprintf(stderr, "Got device error 0x%04x: %s\n", err, alcGetString(recorder.mDevice, err));

    alcCaptureCloseDevice(recorder.mDevice);
    recorder.mDevice = NULL;

    free(recorder.mBuffer);
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    total_size = ftell(recorder.mFile);
    if(fseek(recorder.mFile, recorder.mDataSizeOffset, SEEK_SET) == 0)
    {
        fwrite32le(recorder.mDataSize*recorder.mFrameSize, recorder.mFile);
        if(fseek(recorder.mFile, 4, SEEK_SET) == 0)
            fwrite32le((ALuint)total_size - 8, recorder.mFile);
    }

    fclose(recorder.mFile);
    recorder.mFile = NULL;

    return 0;
}